

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::RemoveDefinition(cmMakefile *this,string *name)

{
  bool bVar1;
  cmVariableWatch *this_00;
  cmVariableWatch *vv;
  string *name_local;
  cmMakefile *this_local;
  
  bVar1 = VariableInitialized(this,name);
  if (bVar1) {
    LogUnused(this,"unsetting",name);
  }
  cmStateSnapshot::RemoveDefinition(&this->StateSnapshot,name);
  this_00 = GetVariableWatch(this);
  if (this_00 != (cmVariableWatch *)0x0) {
    cmVariableWatch::VariableAccessed(this_00,name,4,(char *)0x0,this);
  }
  return;
}

Assistant:

void cmMakefile::RemoveDefinition(const std::string& name)
{
  if (this->VariableInitialized(name)) {
    this->LogUnused("unsetting", name);
  }
  this->StateSnapshot.RemoveDefinition(name);
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmVariableWatch* vv = this->GetVariableWatch();
  if (vv) {
    vv->VariableAccessed(name, cmVariableWatch::VARIABLE_REMOVED_ACCESS,
                         CM_NULLPTR, this);
  }
#endif
}